

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fMultisampleTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::MultisampleCase::MultisampleCase
          (MultisampleCase *this,Context *context,char *name,char *desc)

{
  deUint32 seed;
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,desc);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MultisampleCase_021740a0;
  this->m_numSamples = 0;
  this->m_viewportSize = 0;
  this->m_program = (ShaderProgram *)0x0;
  this->m_attrPositionLoc = -1;
  this->m_attrColorLoc = -1;
  this->m_viewportX = 0;
  this->m_viewportY = 0;
  seed = deStringHash(name);
  deRandom_init(&(this->m_rnd).m_rnd,seed);
  return;
}

Assistant:

MultisampleCase::MultisampleCase (Context& context, const char* name, const char* desc)
	: TestCase			(context, name, desc)
	, m_numSamples		(0)
	, m_viewportSize	(0)
	, m_program			(DE_NULL)
	, m_attrPositionLoc	(-1)
	, m_attrColorLoc	(-1)
	, m_viewportX		(0)
	, m_viewportY		(0)
	, m_rnd				(deStringHash(name))
{
}